

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessor::tryPullOutCardFromFoundationPile
          (EventsProcessor *this,PileId *id,MouseLeftButtonDown *event,
          FoundationPileCollider *collider)

{
  Context *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 local_34;
  PileId local_2c;
  FoundationPileCollider *local_28;
  FoundationPileCollider *collider_local;
  MouseLeftButtonDown *event_local;
  PileId *id_local;
  EventsProcessor *this_local;
  
  local_28 = collider;
  collider_local = (FoundationPileCollider *)event;
  event_local = (MouseLeftButtonDown *)id;
  id_local = (PileId *)this;
  iVar2 = (*this->context->_vptr_Context[4])();
  piles::PileId::PileId(&local_2c,id);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar2),&local_2c);
  (*this->context->_vptr_Context[2])(this->context,collider_local);
  pCVar1 = this->context;
  iVar2 = (*local_28->_vptr_FoundationPileCollider[4])();
  local_34 = CONCAT44(extraout_var_00,iVar2);
  (*pCVar1->_vptr_Context[3])(pCVar1,&local_34);
  return;
}

Assistant:

void EventsProcessor::tryPullOutCardFromFoundationPile(
    const PileId id, const MouseLeftButtonDown& event,
    const FoundationPileCollider& collider) const
{
    context.getSolitaire().tryPullOutCardFromFoundationPile(id);
    context.setMousePosition(event.position);
    context.setCardsInHandPosition(collider.getPosition());
}